

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O0

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::multAdd<double,double>
          (SSVectorBase<double> *this,double xx,SVectorBase<double> *vec)

{
  double dVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  double *pdVar6;
  char *pcVar7;
  double *pdVar8;
  element_type *peVar9;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  SVectorBase<double> *in_RSI;
  SSVectorBase<double> *in_RDI;
  double in_XMM0_Qa;
  double dVar11;
  int *endptr;
  int *iiptr;
  int *iptr;
  int i;
  int j;
  bool adjust;
  double x;
  double *v;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  SVectorBase<double> *in_stack_ffffffffffffff90;
  double dVar12;
  double *in_stack_ffffffffffffff98;
  VectorBase<double> *in_stack_ffffffffffffffa0;
  int *local_48;
  int *local_40;
  uint local_34;
  
  bVar3 = isSetup(in_RDI);
  if (bVar3) {
    pdVar6 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x247a13);
    bVar3 = false;
    local_34 = SVectorBase<double>::size(in_RSI);
    uVar10 = extraout_RDX;
    while (local_34 = local_34 - 1, -1 < (int)local_34) {
      pcVar7 = SVectorBase<double>::index(in_RSI,(char *)(ulong)local_34,(int)uVar10);
      iVar5 = (int)pcVar7;
      if ((pdVar6[iVar5] != 0.0) || (NAN(pdVar6[iVar5]))) {
        dVar11 = pdVar6[iVar5];
        dVar12 = in_XMM0_Qa;
        pdVar8 = SVectorBase<double>::value(in_RSI,local_34);
        dVar1 = *pdVar8;
        tolerances(in_RDI);
        peVar9 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x247ad1);
        Tolerances::epsilon(peVar9);
        bVar4 = isNotZero<double,double>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        uVar10 = extraout_RDX_00;
        if (bVar4) {
          pdVar6[iVar5] = dVar11 + dVar12 * dVar1;
        }
        else {
          bVar3 = true;
          pdVar6[iVar5] = 1e-100;
        }
      }
      else {
        in_stack_ffffffffffffff80 = in_XMM0_Qa;
        pdVar8 = SVectorBase<double>::value(in_RSI,local_34);
        dVar11 = in_stack_ffffffffffffff80 * *pdVar8;
        tolerances(in_RDI);
        peVar9 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x247b6d);
        Tolerances::epsilon(peVar9);
        bVar4 = isNotZero<double,double>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        uVar10 = extraout_RDX_01;
        if (bVar4) {
          pdVar6[iVar5] = dVar11;
          IdxSet::addIdx(&in_RDI->super_IdxSet,iVar5);
          uVar10 = extraout_RDX_02;
        }
      }
    }
    if (bVar3) {
      local_48 = (in_RDI->super_IdxSet).idx;
      piVar2 = (in_RDI->super_IdxSet).idx;
      iVar5 = (in_RDI->super_IdxSet).num;
      for (local_40 = (in_RDI->super_IdxSet).idx; local_40 < piVar2 + iVar5; local_40 = local_40 + 1
          ) {
        dVar11 = pdVar6[*local_40];
        tolerances(in_RDI);
        peVar9 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x247c3b);
        Tolerances::epsilon(peVar9);
        bVar3 = isNotZero<double,double>(in_stack_ffffffffffffff80,dVar11);
        if (bVar3) {
          *local_48 = *local_40;
          local_48 = local_48 + 1;
        }
        else {
          pdVar6[*local_40] = 0.0;
        }
      }
      (in_RDI->super_IdxSet).num = (int)((long)local_48 - (long)(in_RDI->super_IdxSet).idx >> 2);
    }
  }
  else {
    VectorBase<double>::multAdd<double,double>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  return in_RDI;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::multAdd(S xx, const SVectorBase<T>& vec)
{
   if(isSetup())
   {
      R* v = VectorBase<R>::val.data();
      R x;
      bool adjust = false;
      int j;

      for(int i = vec.size() - 1; i >= 0; --i)
      {
         j = vec.index(i);

         if(v[j] != 0)
         {
            x = v[j] + xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
               v[j] = x;
            else
            {
               adjust = true;
               v[j] = SOPLEX_VECTOR_MARKER;
            }
         }
         else
         {
            x = xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
            {
               v[j] = x;
               addIdx(j);
            }
         }
      }

      if(adjust)
      {
         int* iptr = idx;
         int* iiptr = idx;
         int* endptr = idx + num;

         for(; iptr < endptr; ++iptr)
         {
            x = v[*iptr];

            if(isNotZero(x, this->tolerances()->epsilon()))
               *iiptr++ = *iptr;
            else
               v[*iptr] = 0;
         }

         num = int(iiptr - idx);
      }
   }
   else
      VectorBase<R>::multAdd(xx, vec);

   assert(isConsistent());

   return *this;
}